

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

void htmlAutoClose(htmlParserCtxtPtr ctxt,xmlChar *newtag)

{
  endElementSAXFunc p_Var1;
  int iVar2;
  xmlChar *pxVar3;
  
  if (newtag != (xmlChar *)0x0) {
    while ((ctxt->name != (xmlChar *)0x0 &&
           (iVar2 = htmlCheckAutoClose(newtag,ctxt->name), iVar2 != 0))) {
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var1 = ctxt->sax->endElement, p_Var1 != (endElementSAXFunc)0x0)) {
        (*p_Var1)(ctxt->userData,ctxt->name);
      }
      iVar2 = ctxt->nameNr;
      if (0 < (long)iVar2) {
        ctxt->nameNr = iVar2 - 1U;
        if (iVar2 == 1) {
          pxVar3 = (xmlChar *)0x0;
        }
        else {
          pxVar3 = ctxt->nameTab[(long)iVar2 + -2];
        }
        ctxt->name = pxVar3;
        ctxt->nameTab[iVar2 - 1U] = (xmlChar *)0x0;
      }
    }
    return;
  }
  htmlAutoCloseOnEnd(ctxt);
  return;
}

Assistant:

static void
htmlAutoClose(htmlParserCtxtPtr ctxt, const xmlChar * newtag)
{
    while ((newtag != NULL) && (ctxt->name != NULL) &&
           (htmlCheckAutoClose(newtag, ctxt->name))) {
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
    if (newtag == NULL) {
        htmlAutoCloseOnEnd(ctxt);
        return;
    }
    while ((newtag == NULL) && (ctxt->name != NULL) &&
           ((xmlStrEqual(ctxt->name, BAD_CAST "head")) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "body")) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "html")))) {
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}